

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O2

int anon_unknown.dwarf_111dc::RtMidiIn_ctor(lua_State *L)

{
  RtMidi *midi;
  mapped_type *pmVar1;
  allocator<char> local_39;
  string local_38;
  
  midi = (RtMidi *)lua_newuserdata(L,0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RtMidi Input Client",&local_39);
  RtMidiIn::RtMidiIn((RtMidiIn *)midi,UNSPECIFIED,&local_38,100);
  std::__cxx11::string::~string((string *)&local_38);
  RtMidi_init(midi,L,-1);
  local_38._M_dataplus._M_p = (pointer)midi;
  local_38._M_string_length = (size_type)L;
  pmVar1 = std::
           map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
           ::operator[]((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidiIn_callbacks,(key_type *)&local_38);
  *pmVar1 = -2;
  lua_getfield(L,0xffffd8f0,"luartmidi.rtmidiin");
  lua_setmetatable(L,0xfffffffffffffffe);
  return 1;
}

Assistant:

int RtMidiIn_ctor(lua_State *L) {
	auto midiin = reinterpret_cast<RtMidiIn *>(
	 lua_newuserdata(L, sizeof(RtMidiIn)));
	try {
		new (midiin) RtMidiIn { };
		RtMidi_init(*midiin, L, -1);
		RtMidiIn_callbacks[{midiin, L}] = LUA_NOREF;
		luaL_getmetatable(L, MT_RTMIDIIN);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}